

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void Free(void *ptr)

{
  MemInfo *__ptr;
  long in_RDI;
  MemInfo *point;
  
  __ptr = (MemInfo *)(in_RDI + -0x18);
  if (MallocKey == __ptr) {
    MallocKey = __ptr->prev;
    if (MallocKey != (MemInfo *)0x0) {
      MallocKey->next = (MemInfo *)0x0;
    }
  }
  else {
    if (__ptr->prev != (MemInfo *)0x0) {
      __ptr->prev->next = *(MemInfo **)(in_RDI + -0x10);
    }
    if (*(long *)(in_RDI + -0x10) != 0) {
      **(undefined8 **)(in_RDI + -0x10) = __ptr->prev;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void Free(void *ptr)
{
  struct MemInfo *point;
  /* `point' points to the MemInfo structure: */
  point=(struct MemInfo *)((char *)ptr-sizeof(struct MemInfo));

  if(MallocKey==point) {
    /* if this is the last Malloc, set `last' to `prev' */
    MallocKey=point->prev;
    if(MallocKey)
      MallocKey->next=NULL;
  } else {
    /* point the previous' `next' to our `next', and our next `previous'
       to our `previous'. Unlink us from the chain */
    if(point->prev)
      /* only if we aren't the _first_ Malloc() ! */
      point->prev->next=point->next;
    if(point->next)
      /* only if there is a next! */
      point->next->prev=point->prev;
  }
#ifdef DEBUG
  mem-=point->size+sizeof(struct MemInfo);

  CheckMem(ptr);
#endif

#ifdef AMIGA  
  FreeMem(point, point->size+sizeof(struct MemInfo));
#elif unix
  free(point);
#endif
}